

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O0

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  undefined8 uVar2;
  byte bVar3;
  option_group_definition *l_00;
  pointer prVar4;
  uint *puVar5;
  ostream *poVar6;
  base_learner *pbVar7;
  learner<recall_tree_ns::recall_tree,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type_conflict _Var8;
  double dVar9;
  learner<recall_tree_ns::recall_tree,_example> *l;
  option_group_definition new_options;
  free_ptr<recall_tree_ns::recall_tree> tree;
  undefined4 in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff72c;
  vw *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff738;
  _func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *predict;
  typed_option<float> *in_stack_fffffffffffff740;
  parser *base;
  free_ptr<recall_tree_ns::recall_tree> *in_stack_fffffffffffff750;
  learner<recall_tree_ns::recall_tree,_example> *this_00;
  prediction_type_t pred_type;
  char *local_890;
  typed_option<float> *in_stack_fffffffffffff778;
  option_group_definition *in_stack_fffffffffffff780;
  recall_tree *in_stack_fffffffffffff790;
  size_t local_830;
  size_t local_7e8;
  allocator local_6a9;
  string local_6a8 [32];
  uint local_688;
  allocator local_681;
  string local_680 [32];
  undefined4 local_660;
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [32];
  typed_option<bool> local_5e8;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<bool> local_4f8;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  typed_option<unsigned_long> local_408;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [199];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  typed_option<unsigned_long> local_228;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_int> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  vw *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<recall_tree_ns::recall_tree>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Recall Tree",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"recall_tree",&local_159);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b89c8);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff738,(uint *)in_stack_fffffffffffff730)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_138,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Use online tree for multiclass",&local_181);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff780,(typed_option<unsigned_int> *)in_stack_fffffffffffff778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"max_candidates",&local_249);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b8ab3);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff738,(unsigned_long *)in_stack_fffffffffffff730);
  VW::config::typed_option<unsigned_long>::keep(&local_228,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"maximum number of labels per leaf in the tree",&local_271)
  ;
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  l_00 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                   (in_stack_fffffffffffff780,
                    (typed_option<unsigned_long> *)in_stack_fffffffffffff778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"bern_hyper",&local_339);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b8b9e);
  VW::config::make_option<float>(in_stack_fffffffffffff738,(float *)in_stack_fffffffffffff730);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff740,(float)((ulong)in_stack_fffffffffffff738 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"recall tree depth penalty",&local_361);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"max_depth",&local_429);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b8c8c);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff738,(unsigned_long *)in_stack_fffffffffffff730);
  VW::config::typed_option<unsigned_long>::keep(&local_408,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_450,"maximum depth of the tree, default log_2 (#classes)",&local_451);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff780,(typed_option<unsigned_long> *)in_stack_fffffffffffff778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"node_only",&local_519);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b8d77);
  VW::config::make_option<bool>(in_stack_fffffffffffff738,(bool *)in_stack_fffffffffffff730);
  VW::config::typed_option<bool>::keep(&local_4f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,"only use node features, not full path features",&local_541);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff780,(typed_option<bool> *)in_stack_fffffffffffff778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"randomized_routing",&local_609);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b8e62);
  VW::config::make_option<bool>(in_stack_fffffffffffff738,(bool *)in_stack_fffffffffffff730);
  VW::config::typed_option<bool>::keep(&local_5e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"randomized routing",&local_631);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff730,
             (string *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff780,(typed_option<bool> *)in_stack_fffffffffffff778);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff730);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (*(code *)**(undefined8 **)local_10)(local_10,local_60);
  uVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"recall_tree",&local_659);
  bVar3 = (**(code **)(*(long *)uVar2 + 8))(uVar2,local_658);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  pvVar1 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9693);
    uVar2 = local_10;
    prVar4->all = pvVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_680,"max_candidates",&local_681);
    bVar3 = (**(code **)(*(long *)uVar2 + 8))(uVar2,local_680);
    if ((bVar3 & 1) == 0) {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9743);
      std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b975c);
      _Var8 = std::log<unsigned_int>(0);
      dVar9 = log(2.0);
      dVar9 = ceil(_Var8 / dVar9);
      local_688 = (int)(long)dVar9 << 2;
      puVar5 = std::min<unsigned_int>(&prVar4->k,&local_688);
      local_7e8 = (size_t)*puVar5;
    }
    else {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b971d);
      local_7e8 = prVar4->max_candidates;
    }
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b97ee);
    prVar4->max_candidates = local_7e8;
    std::__cxx11::string::~string(local_680);
    std::allocator<char>::~allocator((allocator<char> *)&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6a8,"max_depth",&local_6a9);
    bVar3 = (**(code **)(*(long *)local_10 + 8))(local_10,local_6a8);
    if ((bVar3 & 1) == 0) {
      std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b98ae);
      _Var8 = std::log<unsigned_int>(0);
      dVar9 = log(2.0);
      dVar9 = ceil(_Var8 / dVar9);
      local_830 = (long)dVar9 & 0xffffffff;
    }
    else {
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9893);
      local_830 = prVar4->max_depth;
    }
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9917);
    prVar4->max_depth = local_830;
    std::__cxx11::string::~string(local_6a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
    std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::get
              ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)
               in_stack_fffffffffffff730);
    recall_tree_ns::init_tree(in_stack_fffffffffffff790);
    if ((local_18->quiet & 1U) == 0) {
      poVar6 = std::operator<<(&(local_18->trace_message).super_ostream,"recall_tree:");
      poVar6 = std::operator<<(poVar6," node_only = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b99b9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(prVar4->node_only & 1));
      poVar6 = std::operator<<(poVar6," bern_hyper = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b99f9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,prVar4->bern_hyper);
      poVar6 = std::operator<<(poVar6," max_depth = ");
      prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                         ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9a34);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,prVar4->max_depth);
      poVar6 = std::operator<<(poVar6," routing = ");
      if ((local_18->training & 1U) == 0) {
        local_890 = "n/a testonly";
      }
      else {
        prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                           ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9a7f);
        local_890 = "deterministic";
        if ((prVar4->randomized_routing & 1U) != 0) {
          local_890 = "randomized";
        }
      }
      poVar6 = std::operator<<(poVar6,local_890);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pbVar7 = setup_base((options_i *)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
    pred_type = (prediction_type_t)pbVar7;
    LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    base = local_18->p;
    in_stack_fffffffffffff740 = (typed_option<float> *)&stack0xffffffffffffffd8;
    prVar4 = std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
                       ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9bbc);
    predict = (_func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *)
              prVar4->max_routers;
    std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::operator->
              ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)0x2b9bcf);
    this = LEARNER::
           init_multiclass_learner<recall_tree_ns::recall_tree,example,LEARNER::learner<char,example>>
                     (in_stack_fffffffffffff750,(learner<char,_example> *)base,
                      (_func_void_recall_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff740,predict,(parser *)in_stack_fffffffffffff730,
                      CONCAT44(in_stack_fffffffffffff72c,4),pred_type);
    this_00 = this;
    LEARNER::learner<recall_tree_ns::recall_tree,_example>::set_save_load
              (this,recall_tree_ns::save_load_tree);
    LEARNER::learner<recall_tree_ns::recall_tree,_example>::set_finish
              (this_00,(_func_void_recall_tree_ptr *)base);
    in_stack_fffffffffffff730 = (vw *)LEARNER::make_base<recall_tree_ns::recall_tree,example>(this);
    local_8 = in_stack_fffffffffffff730;
  }
  else {
    local_8 = (vw *)0x0;
  }
  local_660 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff730);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)> *)in_stack_fffffffffffff740)
  ;
  return (base_learner *)(vw *)local_8;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}